

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O3

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform<bool,double>
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,
          ArrayView<soul::Value> args,_func_bool_double *fn)

{
  bool v;
  Value *extraout_RAX;
  PackedData local_30;
  
  if ((long)args.s - (long)this != 0x40) {
    throwInternalCompilerError("args.size() == 1","perform",0x22);
  }
  if ((Value *)this != args.s) {
    soul::Value::getData(&local_30,(Value *)this);
    soul::Value::PackedData::getAsDouble(&local_30);
    v = (bool)(*(code *)args.e)();
    soul::Value::Value(__return_storage_ptr__,v);
    return extraout_RAX;
  }
  throwInternalCompilerError("! empty()","front",0xbf);
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}